

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImGuiListClipper::End(ImGuiListClipper *this)

{
  int iVar1;
  long *plVar2;
  ImGuiContext *pIVar3;
  ImGuiListClipperData *pIVar4;
  
  pIVar3 = GImGui;
  plVar2 = (long *)this->TempData;
  if (plVar2 != (long *)0x0) {
    if (((uint)this->ItemsCount < 0x7fffffff) && (-1 < this->DisplayStart)) {
      ImGuiListClipper_SeekCursorForItem(this,this->ItemsCount);
    }
    if ((ImGuiListClipper *)*plVar2 != this) {
      __assert_fail("data->ListClipper == this",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                    ,0xa47,"void ImGuiListClipper::End()");
    }
    *(int *)((long)plVar2 + 0xc) = (int)plVar2[3];
    iVar1 = pIVar3->ClipperTempDataStacked;
    pIVar3->ClipperTempDataStacked = iVar1 + -1;
    if (1 < iVar1) {
      pIVar4 = ImVector<ImGuiListClipperData>::operator[](&pIVar3->ClipperTempData,iVar1 + -2);
      pIVar4->ListClipper->TempData = pIVar4;
    }
    this->TempData = (void *)0x0;
  }
  this->ItemsCount = -1;
  return;
}

Assistant:

void ImGuiListClipper::End()
{
    ImGuiContext& g = *GImGui;
    if (ImGuiListClipperData* data = (ImGuiListClipperData*)TempData)
    {
        // In theory here we should assert that we are already at the right position, but it seems saner to just seek at the end and not assert/crash the user.
        if (ItemsCount >= 0 && ItemsCount < INT_MAX && DisplayStart >= 0)
            ImGuiListClipper_SeekCursorForItem(this, ItemsCount);

        // Restore temporary buffer and fix back pointers which may be invalidated when nesting
        IM_ASSERT(data->ListClipper == this);
        data->StepNo = data->Ranges.Size;
        if (--g.ClipperTempDataStacked > 0)
        {
            data = &g.ClipperTempData[g.ClipperTempDataStacked - 1];
            data->ListClipper->TempData = data;
        }
        TempData = NULL;
    }
    ItemsCount = -1;
}